

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateViewIndexAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  bool bVar1;
  BuiltIn operand;
  StorageClass SVar2;
  _Rb_tree_node_base *p_Var3;
  mapped_type *this_00;
  char *pcVar4;
  spv_result_t sVar5;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  uint32_t local_26c;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  operand = Decoration::builtin(decoration);
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    SVar2 = GetStorageClass(referenced_from_inst);
    if ((SVar2 != Input) && (SVar2 != Max)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_268,this->_,0x1132,(char *)0x0);
      std::operator<<((ostream *)local_208,(string *)&local_268);
      std::operator<<((ostream *)local_208,"Vulkan spec allows BuiltIn ");
      pcVar4 = AssemblyGrammar::lookupOperandName
                         (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,operand);
      std::operator<<((ostream *)local_208,pcVar4);
      std::operator<<((ostream *)local_208,
                      " to be only used for variables with Input storage class. ");
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                 ExecutionModelMax);
      std::operator<<((ostream *)local_208,(string *)&local_248);
      std::operator<<((ostream *)local_208," ");
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_228,this,referenced_from_inst);
      std::operator<<((ostream *)local_208,(string *)&local_228);
      std::__cxx11::string::_M_dispose();
      sVar5 = local_38;
LAB_001a0818:
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return sVar5;
    }
    for (p_Var3 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if (p_Var3[1]._M_color == 5) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst
                  );
        ValidationState_t::VkErrorID_abi_cxx11_(&local_268,this->_,0x1131,(char *)0x0);
        std::operator<<((ostream *)local_208,(string *)&local_268);
        std::operator<<((ostream *)local_208,"Vulkan spec allows BuiltIn ");
        pcVar4 = AssemblyGrammar::lookupOperandName
                           (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,operand);
        std::operator<<((ostream *)local_208,pcVar4);
        std::operator<<((ostream *)local_208," to be not be used with GLCompute execution model. ");
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                   ExecutionModelGLCompute);
        std::operator<<((ostream *)local_208,(string *)&local_248);
        sVar5 = local_38;
        goto LAB_001a0818;
      }
    }
  }
  if (this->function_id_ == 0) {
    local_26c = (referenced_from_inst->inst_).result_id;
    this_00 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,&local_26c);
    local_248._M_dataplus._M_p = (pointer)ValidateViewIndexAtReference;
    local_248._M_string_length = 0;
    local_228._M_dataplus._M_p = (pointer)this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              ((type *)local_208,(offset_in_BuiltInsValidator_to_subr *)&local_248,
               (BuiltInsValidator **)&local_228,decoration,built_in_inst,referenced_from_inst,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_268,
               (type *)local_208);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(this_00,(value_type *)&local_268);
    if ((code *)local_268.field_2._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_268.field_2._M_allocated_capacity)(&local_268,&local_268,3);
    }
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::~_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    *)(local_208 + 0x10));
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateViewIndexAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  uint32_t operand = (uint32_t)decoration.builtin();
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(4402) << "Vulkan spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              operand)
             << " to be only used for variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model == spv::ExecutionModel::GLCompute) {
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(4401) << "Vulkan spec allows BuiltIn "
               << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                operand)
               << " to be not be used with GLCompute execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateViewIndexAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}